

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

bool __thiscall btSingleSweepCallback::process(btSingleSweepCallback *this,btBroadphaseProxy *proxy)

{
  float fVar1;
  uint uVar2;
  btBroadphaseProxy *pbVar3;
  btTransform *colObjWorldTransform;
  btTransform *in_RSI;
  btCollisionObject *in_RDI;
  ConvexResultCallback *unaff_retaddr;
  btCollisionObject *collisionObject;
  btCollisionObject *this_00;
  btBroadphaseProxy *collisionShape;
  btCollisionObject *this_01;
  btCollisionObject *castShape;
  bool local_1;
  btScalar allowedPenetration;
  
  fVar1 = *(float *)&in_RDI->m_broadphaseHandle->m_collisionFilterGroup;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this_00 = *(btCollisionObject **)(in_RSI->m_basis).m_el[0].m_floats;
    collisionShape = in_RDI->m_broadphaseHandle;
    castShape = in_RDI;
    pbVar3 = btCollisionObject::getBroadphaseHandle(this_00);
    uVar2 = (**(_func_int **)((long)collisionShape->m_clientObject + 0x10))(collisionShape,pbVar3);
    if ((uVar2 & 1) != 0) {
      this_01 = this_00;
      colObjWorldTransform = (btTransform *)btCollisionObject::getCollisionShape(this_00);
      allowedPenetration = (btScalar)((ulong)this_00 >> 0x20);
      btCollisionObject::getWorldTransform(this_01);
      btCollisionWorld::objectQuerySingle
                ((btConvexShape *)castShape,in_RSI,(btTransform *)this_01,in_RDI,
                 (btCollisionShape *)collisionShape,colObjWorldTransform,unaff_retaddr,
                 allowedPenetration);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

virtual bool	process(const btBroadphaseProxy* proxy)
	{
		///terminate further convex sweep tests, once the closestHitFraction reached zero
		if (m_resultCallback.m_closestHitFraction == btScalar(0.f))
			return false;

		btCollisionObject*	collisionObject = (btCollisionObject*)proxy->m_clientObject;

		//only perform raycast if filterMask matches
		if(m_resultCallback.needsCollision(collisionObject->getBroadphaseHandle())) {
			//RigidcollisionObject* collisionObject = ctrl->GetRigidcollisionObject();
			m_world->objectQuerySingle(m_castShape, m_convexFromTrans,m_convexToTrans,
				collisionObject,
				collisionObject->getCollisionShape(),
				collisionObject->getWorldTransform(),
				m_resultCallback,
				m_allowedCcdPenetration);
		}

		return true;
	}